

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall google::FlagSaverImpl::SaveFromRegistry(FlagSaverImpl *this)

{
  Mutex *pMVar1;
  pointer *pppCVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FlagRegistry *pFVar6;
  CommandLineFlag *src;
  char *pcVar7;
  pointer __src;
  char *pcVar8;
  char *pcVar9;
  CommandLineFlag *this_00;
  FlagValue *pFVar10;
  FlagValue *pFVar11;
  ulong uVar12;
  pointer ppCVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  size_t __n;
  ulong uVar16;
  
  pFVar6 = this->main_registry_;
  iVar3 = (pFVar6->lock_).mutex_;
  (pFVar6->lock_).mutex_ = iVar3 + -1;
  if (iVar3 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  if ((this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("backup_registry_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x678,"void google::FlagSaverImpl::SaveFromRegistry()");
  }
  p_Var14 = (pFVar6->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var14 == &(pFVar6->flags_)._M_t._M_impl.super__Rb_tree_header) {
    (pFVar6->lock_).mutex_ = 0;
  }
  else {
    do {
      src = (CommandLineFlag *)p_Var14[1]._M_parent;
      this_00 = (CommandLineFlag *)operator_new(0x38);
      pcVar8 = src->name_;
      pcVar9 = src->help_;
      pcVar7 = src->file_;
      pFVar11 = src->current_;
      uVar4._0_1_ = pFVar11->type_;
      uVar4._1_1_ = pFVar11->owns_value_;
      uVar4._2_2_ = *(undefined2 *)&pFVar11->field_0xa;
      pFVar10 = anon_unknown_1::FlagValue::New((FlagValue *)(ulong)uVar4);
      pFVar11 = src->defvalue_;
      uVar5._0_1_ = pFVar11->type_;
      uVar5._1_1_ = pFVar11->owns_value_;
      uVar5._2_2_ = *(undefined2 *)&pFVar11->field_0xa;
      pFVar11 = anon_unknown_1::FlagValue::New((FlagValue *)(ulong)uVar5);
      this_00->name_ = pcVar8;
      this_00->help_ = pcVar9;
      this_00->file_ = pcVar7;
      this_00->modified_ = false;
      this_00->defvalue_ = pFVar11;
      this_00->current_ = pFVar10;
      this_00->validate_fn_proto_ = (ValidateFnProto)0x0;
      anon_unknown_1::CommandLineFlag::CopyFrom(this_00,src);
      ppCVar13 = (this->backup_registry_).
                 super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar13 ==
          (this->backup_registry_).
          super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __src = (this->backup_registry_).
                super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)ppCVar13 - (long)__src;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar16 = (long)__n >> 3;
        uVar12 = uVar16;
        if (ppCVar13 == __src) {
          uVar12 = 1;
        }
        uVar15 = uVar12 + uVar16;
        if (0xffffffffffffffe < uVar15) {
          uVar15 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar12,uVar16)) {
          uVar15 = 0xfffffffffffffff;
        }
        if (uVar15 == 0) {
          ppCVar13 = (pointer)0x0;
        }
        else {
          ppCVar13 = (pointer)operator_new(uVar15 * 8);
        }
        ppCVar13[uVar16] = this_00;
        if (0 < (long)__n) {
          memmove(ppCVar13,__src,__n);
        }
        if (__src != (pointer)0x0) {
          operator_delete(__src);
        }
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_start = ppCVar13;
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppCVar13 + __n + 8);
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar13 + uVar15;
      }
      else {
        *ppCVar13 = this_00;
        pppCVar2 = &(this->backup_registry_).
                    super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar2 = *pppCVar2 + 1;
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 !=
             &(this->main_registry_->flags_)._M_t._M_impl.super__Rb_tree_header);
    pMVar1 = &pFVar6->lock_;
    pMVar1->mutex_ = pMVar1->mutex_ + 1;
    if (pMVar1->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                    ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
    }
  }
  return;
}

Assistant:

void SaveFromRegistry() {
    FlagRegistryLock frl(main_registry_);
    assert(backup_registry_.empty());   // call only once!
    for (FlagRegistry::FlagConstIterator it = main_registry_->flags_.begin();
         it != main_registry_->flags_.end();
         ++it) {
      const CommandLineFlag* main = it->second;
      // Sets up all the const variables in backup correctly
      CommandLineFlag* backup = new CommandLineFlag(
          main->name(), main->help(), main->filename(),
          main->current_->New(), main->defvalue_->New());
      // Sets up all the non-const variables in backup correctly
      backup->CopyFrom(*main);
      backup_registry_.push_back(backup);   // add it to a convenient list
    }
  }